

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::TSPI_PDU::SetOrientationErrorFlag(TSPI_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  short sVar2;
  
  if ((((this->m_TSPIFlagUnion).m_ui8Flag & 8) == 0) == F) {
    sVar2 = -6;
    if (F) {
      sVar2 = 6;
    }
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xf7 | F * '\b';
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + sVar2;
  }
  return;
}

Assistant:

void TSPI_PDU::SetOrientationErrorFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8OriErr )return;

    m_TSPIFlagUnion.m_ui8OriErr = F;

    if( F )
    {
        m_ui16PDULength += OrientationError::ORIENTATION_ERROR_SIZE;
    }
    else
    {
        m_ui16PDULength -= OrientationError::ORIENTATION_ERROR_SIZE;
    }
}